

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall QList<int>::QList(QList<int> *this,qsizetype size)

{
  int *piVar1;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  piVar1 = (int *)QArrayData::allocate(&local_28,4,0x10,size,KeepSize);
  (this->d).d = (Data *)local_28;
  (this->d).ptr = piVar1;
  (this->d).size = 0;
  if (size != 0) {
    *piVar1 = 0;
    if (size != 1) {
      memset(piVar1 + 1,0,size * 4 - 4);
    }
    (this->d).size = size;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit QList(qsizetype size)
        : d(size)
    {
        if (size)
            d->appendInitialize(size);
    }